

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O0

Vec3fa embree::renderPixelStandard(float x,float y,ISPCCamera *camera,RayStats *stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  int *in_RDX;
  float *in_RSI;
  ulong *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  ulong uVar7;
  float in_XMM1_Da;
  ulong extraout_XMM1_Qa;
  ulong uVar8;
  Vec3fa VVar9;
  Ray shadow;
  Vec3fa Ng;
  Vec3fa lightDir;
  Vec3fa diffuse;
  Ray ray;
  Vec3fa *color;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 c_2;
  __m128 r_1;
  __m128 a_2;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 c_3;
  __m128 r_2;
  __m128 a_3;
  __m128 mask_2;
  vfloat4 c_4;
  vfloat4 b_1;
  vfloat4 a_4;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a_1;
  float local_1d50;
  float local_1d4c;
  undefined1 local_1cd8 [8];
  ulong uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  ulong uStack_1cb0;
  undefined8 local_1ca8;
  ulong uStack_1ca0;
  undefined8 local_1c98;
  ulong uStack_1c90;
  undefined1 local_1c88 [8];
  ulong uStack_1c80;
  float local_1c78;
  undefined4 local_1c74;
  undefined1 auStack_1c68 [20];
  undefined4 local_1c54;
  undefined4 local_1c50;
  undefined4 local_1c4c;
  undefined4 local_1c48;
  float local_1c34 [3];
  float local_1c28;
  float fStack_1c24;
  ulong uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  float local_1c08;
  float fStack_1c04;
  ulong uStack_1c00;
  undefined8 local_1bf8;
  ulong uStack_1bf0;
  ulong local_1be8;
  ulong uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  float local_1bc4 [3];
  float local_1bb8 [3];
  float local_1bac [3];
  float local_1ba0 [3];
  float local_1b94 [3];
  undefined8 local_1b88;
  ulong uStack_1b80;
  undefined8 local_1b78;
  ulong uStack_1b70;
  undefined8 local_1b68;
  ulong uStack_1b60;
  undefined8 local_1b58;
  ulong uStack_1b50;
  float local_1b48;
  undefined4 local_1b44;
  float local_1b38;
  float local_1b34;
  float local_1b30;
  undefined4 local_1b24;
  int local_1b20;
  undefined4 local_1b1c;
  undefined4 local_1b18;
  int *local_1b00;
  undefined1 local_1af0 [4];
  undefined1 local_1aec [36];
  undefined8 *local_1ac8;
  ulong *local_1ab8;
  undefined4 local_1aac;
  undefined4 local_1aa8;
  undefined4 local_1aa4;
  undefined8 *local_1aa0;
  undefined4 local_1a94;
  undefined4 local_1a90;
  undefined4 local_1a8c;
  undefined8 *local_1a88;
  undefined4 local_1a7c;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined8 *local_1a70;
  float *local_1a68;
  undefined8 *local_1a60;
  float *local_1a58;
  undefined8 *local_1a50;
  float *local_1a48;
  float *local_1a40;
  float local_1a34;
  float *local_1a30;
  float *local_1a28;
  float local_1a1c;
  float *local_1a18;
  float *local_1a10;
  float local_1a04;
  float local_1a00;
  float local_19fc;
  float *local_19f8;
  float *local_19f0;
  float *local_19e8;
  float local_19dc;
  float local_19d8;
  float local_19d4;
  float *local_19d0;
  float *local_19c8;
  float *local_19c0;
  float local_19b4;
  float local_19b0;
  float local_19ac;
  float *local_19a8;
  undefined1 *local_19a0;
  float *local_1998;
  float local_198c;
  float local_1988;
  float local_1984 [3];
  undefined1 *local_1978;
  float *local_1970;
  undefined1 *local_1968;
  undefined1 *local_1960;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined4 local_1950;
  undefined4 local_194c;
  float local_1948;
  undefined4 local_1944;
  undefined8 *local_1940;
  undefined8 *local_1938;
  undefined8 *local_1930;
  undefined4 local_1928;
  undefined4 local_1924;
  undefined4 local_1920;
  undefined4 local_191c;
  float local_1918;
  undefined4 local_1914;
  undefined1 *local_1910;
  undefined8 *local_1908;
  undefined8 *local_1900;
  undefined8 *local_18f8;
  int *local_18f0;
  undefined4 local_18e4;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined4 local_187c;
  undefined8 *local_1878;
  undefined8 *local_1870;
  undefined4 local_1864;
  undefined8 *local_1860;
  ulong *local_1848;
  undefined8 *local_1838;
  float *local_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  float local_1814;
  undefined8 *local_1810;
  float *local_1808;
  float local_17fc;
  undefined8 *local_17f8;
  undefined8 *local_17f0;
  undefined8 *local_17e8;
  undefined8 *local_17e0;
  undefined1 local_17d8 [16];
  undefined8 *local_17c8;
  float local_17bc;
  undefined8 *local_17b8;
  undefined8 *local_17b0;
  undefined8 *local_17a8;
  float *local_17a0;
  undefined1 *local_1798;
  undefined8 *local_1790;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 *local_1758;
  undefined8 *local_1750;
  undefined8 *local_1708;
  undefined8 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  float *local_16e0;
  undefined8 *local_16d8;
  undefined8 *local_16d0;
  undefined8 *local_16c8;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  float fStack_1620;
  float fStack_1610;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  undefined4 uStack_15dc;
  undefined8 *local_15d0;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float *local_15b0;
  undefined4 local_15a8;
  undefined4 uStack_15a4;
  undefined4 uStack_15a0;
  undefined4 uStack_159c;
  undefined8 *local_1590;
  undefined8 local_1568;
  ulong uStack_1560;
  undefined8 *local_1550;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  ulong *local_1530;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  ulong uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  float local_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float local_14a8;
  ulong uStack_14a0;
  float local_1498;
  undefined4 local_148c;
  undefined8 local_1488;
  ulong uStack_1480;
  float local_1478;
  undefined4 local_146c;
  undefined8 local_1468;
  ulong uStack_1460;
  float local_1458;
  float local_1454;
  float local_1450;
  undefined4 local_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined4 local_1418;
  undefined4 local_1414;
  undefined4 local_1410;
  undefined4 local_140c;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined1 local_13d8 [8];
  ulong uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined1 local_13b8 [8];
  ulong uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined4 local_138c;
  undefined1 *local_1388;
  undefined1 *local_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  ulong uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  ulong uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined4 local_131c;
  undefined8 *local_1318;
  undefined8 *local_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  ulong uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  ulong uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined4 local_12ac;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  ulong uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  ulong uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined4 local_123c;
  undefined8 *local_1238;
  undefined8 *local_1230;
  undefined1 *local_1228;
  float *local_1220;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined8 *local_1208;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined8 *local_11f0;
  undefined4 local_11e8;
  undefined4 local_11e4;
  undefined4 local_11e0;
  undefined4 local_11dc;
  undefined8 *local_11d8;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined4 local_11c4;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 *local_1178;
  undefined8 *local_1170;
  undefined8 *local_1168;
  undefined8 *local_1160;
  undefined8 *local_1158;
  undefined1 *local_1150;
  undefined8 *local_1148;
  undefined1 *local_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 *local_10f8;
  undefined8 *local_10f0;
  undefined8 *local_10e8;
  undefined8 *local_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 *local_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 *local_1060;
  ulong uStack_1050;
  undefined1 *local_1040;
  undefined8 local_1038;
  ulong uStack_1030;
  undefined8 *local_1020;
  undefined8 local_1018;
  ulong uStack_1010;
  undefined8 *local_1000;
  undefined8 local_ff8;
  ulong uStack_ff0;
  undefined8 *local_fe0;
  undefined8 local_fd8;
  ulong uStack_fd0;
  undefined8 *local_fc0;
  undefined8 local_fb8;
  ulong uStack_fb0;
  undefined8 *local_fa0;
  undefined8 local_f98;
  ulong uStack_f90;
  undefined8 *local_f80;
  ulong uStack_f70;
  undefined1 *local_f60;
  undefined4 local_f54;
  undefined8 *local_f50;
  undefined4 local_f44;
  undefined8 *local_f40;
  undefined4 local_f34;
  undefined8 *local_f30;
  undefined4 local_f24;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined1 *local_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 local_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined4 local_e88;
  undefined4 local_e84;
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  ulong uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  ulong uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  ulong uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  ulong uStack_e00;
  ulong uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  ulong uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  ulong uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  ulong uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined1 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined4 local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 local_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_bdc;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 local_bbc;
  undefined4 local_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 local_b88;
  ulong local_b78;
  undefined8 uStack_b70;
  undefined1 local_b68 [16];
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined4 local_b3c;
  ulong local_b38;
  undefined8 uStack_b30;
  undefined1 local_b28 [16];
  ulong local_b18;
  undefined8 uStack_b10;
  float local_afc;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  ulong local_ad8;
  undefined8 uStack_ad0;
  float local_abc;
  undefined1 local_ab8 [16];
  undefined4 local_a9c;
  undefined1 local_a98 [16];
  undefined4 local_a7c;
  undefined1 local_a78 [16];
  float local_a5c;
  undefined1 local_a58 [16];
  undefined4 local_a3c;
  undefined1 local_a38 [16];
  undefined4 local_a1c;
  undefined1 local_a18 [16];
  float local_9fc;
  undefined1 local_9f8 [16];
  undefined4 local_9dc;
  undefined1 local_9d8 [16];
  undefined4 local_9bc;
  undefined1 local_9b8 [16];
  undefined4 local_99c;
  ulong local_998;
  undefined8 uStack_990;
  ulong local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  ulong local_968;
  undefined8 uStack_960;
  ulong local_958;
  undefined8 uStack_950;
  ulong local_948;
  undefined8 uStack_940;
  ulong local_938;
  undefined8 uStack_930;
  ulong local_928;
  undefined8 uStack_920;
  ulong local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  ulong local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  ulong local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  ulong local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  ulong local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  ulong local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  ulong local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  ulong local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  ulong local_738;
  undefined8 uStack_730;
  ulong local_728;
  undefined8 uStack_720;
  ulong local_718;
  undefined8 uStack_710;
  ulong local_708;
  undefined8 uStack_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined1 *local_6d8;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined8 *local_690;
  float local_684;
  undefined1 *local_680;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  float *local_648;
  undefined1 *local_640;
  float local_638;
  float fStack_634;
  ulong uStack_630;
  undefined1 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined4 local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  float local_5c8;
  float fStack_5c4;
  ulong uStack_5c0;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_18;
  float local_c;
  
  local_1a68 = in_RSI + 9;
  local_1450 = in_RSI[0xb];
  local_1458 = *local_1a68;
  local_1454 = in_RSI[10];
  local_1468 = *(undefined8 *)local_1a68;
  local_144c = 0;
  uStack_1460 = (ulong)(uint)local_1450;
  local_19c8 = local_1bb8;
  local_1978 = local_1aec;
  local_1984[0] = in_XMM0_Da * *in_RSI;
  local_160 = local_1984;
  local_168 = &local_1988;
  local_170 = &local_198c;
  local_19a8 = in_RSI + 3;
  local_19d0 = local_1bc4;
  local_19a0 = local_1af0;
  local_19ac = in_XMM1_Da * *local_19a8;
  local_140 = &local_19ac;
  local_148 = &local_19b0;
  local_150 = &local_19b4;
  local_19f0 = local_1bac;
  local_19d4 = local_1984[0] + local_19ac;
  local_120 = &local_19d4;
  local_128 = &local_19d8;
  local_130 = &local_19dc;
  local_19f8 = in_RSI + 6;
  local_1a18 = local_1ba0;
  local_19fc = local_19d4 + *local_19f8;
  local_100 = &local_19fc;
  local_108 = &local_1a00;
  local_110 = &local_1a04;
  local_1a58 = local_1b94;
  local_24 = local_1a04 * local_1a04;
  local_30 = local_1a00 * local_1a00 + local_24;
  local_afc = local_19fc * local_19fc + local_30;
  local_a18._4_4_ = 0;
  local_a18._0_4_ = local_afc;
  local_b18 = local_a18._0_8_;
  uStack_b10 = 0;
  local_988 = local_a18._0_8_;
  uStack_980 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_a18._0_8_;
  local_b28 = rsqrtss(auVar2,auVar2);
  local_a1c = 0x3fc00000;
  local_a38 = ZEXT416(0x3fc00000);
  local_7e8 = local_b28._0_8_;
  uVar3 = local_7e8;
  uStack_7e0 = local_b28._8_8_;
  local_7e8._0_4_ = local_b28._0_4_;
  local_7d8 = (ulong)(uint)((float)local_7e8 * 1.5);
  uStack_7d0 = 0;
  local_a3c = 0xbf000000;
  local_a58 = ZEXT416(0xbf000000);
  local_808 = local_a58._0_8_;
  uStack_800 = 0;
  local_7f8 = (ulong)(uint)(local_afc * -0.5);
  uStack_7f0 = 0;
  local_828 = local_b28._0_8_;
  uStack_820 = local_b28._8_8_;
  local_1a1c = local_afc * -0.5 * (float)local_7e8;
  local_818 = (ulong)(uint)local_1a1c;
  uStack_810 = 0;
  local_848 = local_b28._0_8_;
  uStack_840 = local_b28._8_8_;
  local_838 = CONCAT44(local_b28._4_4_,(float)local_7e8 * (float)local_7e8);
  uStack_830 = local_b28._8_8_;
  local_868 = local_838;
  uStack_860 = local_b28._8_8_;
  local_1a1c = local_1a1c * (float)local_7e8 * (float)local_7e8;
  local_858 = (ulong)(uint)local_1a1c;
  uStack_850 = 0;
  local_948 = local_858;
  uStack_940 = 0;
  local_1a1c = (float)local_7e8 * 1.5 + local_1a1c;
  local_938 = (ulong)(uint)local_1a1c;
  uStack_930 = 0;
  local_b38 = local_938;
  uStack_b30 = 0;
  local_718 = local_938;
  uStack_710 = 0;
  local_e0 = &local_1a1c;
  local_1478 = local_19fc * local_1a1c;
  fVar5 = local_1a00 * local_1a1c;
  fVar6 = local_1a04 * local_1a1c;
  local_b8 = &local_e4;
  local_c0 = &local_e8;
  local_c8 = &local_ec;
  local_1488 = CONCAT44(local_e8,local_1478);
  local_146c = 0;
  uStack_1480 = (ulong)(uint)local_ec;
  local_1960 = &inf;
  local_1b00 = in_RDX;
  local_1a60 = &local_1b78;
  local_1a50 = &local_1b88;
  local_1a10 = local_1a58;
  local_1a04 = local_19dc + in_RSI[8];
  local_1a00 = local_19d8 + in_RSI[7];
  local_19e8 = local_1a18;
  local_19dc = local_198c + local_19b4;
  local_19d8 = local_1988 + local_19b0;
  local_19c0 = local_19f0;
  local_19b4 = in_XMM1_Da * in_RSI[5];
  local_19b0 = in_XMM1_Da * in_RSI[4];
  local_1998 = local_19d0;
  local_198c = in_XMM0_Da * in_RSI[2];
  local_1988 = in_XMM0_Da * in_RSI[1];
  local_1970 = local_19c8;
  local_a18 = ZEXT416((uint)local_afc);
  local_9fc = local_afc;
  local_7e8 = uVar3;
  local_158 = local_19c8;
  local_138 = local_19d0;
  local_118 = local_19f0;
  local_f8 = local_1a18;
  local_ec = fVar6;
  local_e8 = fVar5;
  local_e4 = local_1478;
  local_d8 = local_1a18;
  local_d0 = local_1a58;
  local_b0 = local_1a58;
  local_60 = local_1a18;
  local_40 = local_1a18;
  local_38 = local_1a18;
  local_2c = local_19fc;
  local_28 = local_19fc;
  local_1bc4[0] = local_19ac;
  local_1bb8[0] = local_1984[0];
  local_1bac[0] = local_19d4;
  local_1ba0[0] = local_19fc;
  local_1b94[0] = local_1478;
  local_1b88 = local_1488;
  uStack_1b80 = uStack_1480;
  local_1b78 = local_1468;
  uStack_1b70 = uStack_1460;
  local_1b48 = std::numeric_limits<float>::infinity();
  local_1930 = &local_1b68;
  local_1944 = 0;
  local_194c = 0;
  local_1950 = 0xffffffff;
  local_1954 = 0xffffffff;
  local_1958 = 0xffffffff;
  local_123c = 0;
  local_1208 = &local_1258;
  local_120c = 0xffffffff;
  local_1210 = 0xffffffff;
  local_1214 = 0xffffffff;
  local_1218 = 0;
  local_e7c = 0;
  local_e80 = 0xffffffff;
  local_e84 = 0xffffffff;
  local_e88 = 0xffffffff;
  local_e98 = 0xffffffffffffffff;
  uStack_e90 = 0xffffffff;
  local_1258 = 0xffffffffffffffff;
  uStack_1250 = 0xffffffff;
  local_1138 = 0xffffffffffffffff;
  uStack_1130 = 0xffffffff;
  local_11a8 = &local_1278;
  local_1278 = 0xffffffffffffffff;
  uStack_1270 = 0xffffffff;
  local_ff8 = local_1b78;
  uStack_fd0 = uStack_1b70;
  local_11b0 = &local_1288;
  local_11b8 = &local_1298;
  local_f54 = 0;
  local_bfc = 0;
  local_c18 = 0;
  uStack_c14 = 0;
  uStack_c10 = 0;
  uStack_c0c = 0;
  local_c98 = 0;
  uStack_c90 = 0;
  local_11a0 = &local_1268;
  local_d88 = 0xffffffffffffffff;
  uStack_d80 = 0xffffffff;
  uStack_ff0 = uStack_1b70 & 0xffffffff;
  local_c88 = 0xffffffffffffffff;
  uStack_c80 = 0xffffffff;
  local_e18 = 0;
  uStack_e10 = 0;
  local_12a0 = &local_1b58;
  local_12ac = 0;
  local_11f0 = &local_12c8;
  local_11f4 = 0xffffffff;
  local_11f8 = 0xffffffff;
  local_11fc = 0xffffffff;
  local_1200 = 0;
  local_e9c = 0;
  local_ea0 = 0xffffffff;
  local_ea4 = 0xffffffff;
  local_ea8 = 0xffffffff;
  local_eb8 = 0xffffffffffffffff;
  uStack_eb0 = 0xffffffff;
  local_12c8 = 0xffffffffffffffff;
  uStack_12c0 = 0xffffffff;
  local_1128 = 0xffffffffffffffff;
  uStack_1120 = 0xffffffff;
  local_1188 = &local_12e8;
  local_12e8 = 0xffffffffffffffff;
  uStack_12e0 = 0xffffffff;
  local_1018 = local_1b88;
  uStack_fb0 = uStack_1b80;
  local_1190 = &local_12f8;
  local_1198 = &local_1308;
  local_f44 = 0;
  local_c1c = 0;
  local_c38 = 0;
  uStack_c34 = 0;
  uStack_c30 = 0;
  uStack_c2c = 0;
  local_cb8 = 0;
  uStack_cb0 = 0;
  local_1180 = &local_12d8;
  local_da8 = 0xffffffffffffffff;
  uStack_da0 = 0xffffffff;
  uStack_1010 = uStack_1b80 & 0xffffffff;
  local_ca8 = 0xffffffffffffffff;
  uStack_ca0 = 0xffffffff;
  local_e38 = 0;
  uStack_e30 = 0;
  local_1b44 = 0xffffffff;
  local_1220 = &local_1b38;
  local_1b24 = 0xffffffff;
  local_1b20 = -1;
  local_1b1c = 0xffffffff;
  local_1b18 = 0xffffffff;
  local_1948 = local_1b48;
  local_1940 = &local_1b88;
  local_1938 = &local_1b78;
  local_18f8 = local_1930;
  local_12a8 = &local_1b88;
  local_1238 = &local_1b78;
  local_1230 = local_1930;
  local_10f8 = local_1208;
  local_10f0 = local_11f0;
  local_10d8 = local_1138;
  uStack_10d0 = uStack_1130;
  local_10c0 = local_11a8;
  local_10b8 = local_1128;
  uStack_10b0 = uStack_1120;
  local_10a0 = local_1188;
  local_1000 = local_1180;
  local_fe0 = local_11a0;
  local_fd8 = local_ff8;
  local_fc0 = local_11b0;
  local_fb8 = local_1018;
  local_fa0 = local_1190;
  local_f50 = local_11b8;
  local_f40 = local_1198;
  local_f18 = local_11a0;
  local_f10 = local_1180;
  local_e28 = local_1018;
  uStack_e20 = uStack_1010;
  local_e08 = local_ff8;
  uStack_e00 = uStack_ff0;
  local_db8 = local_1018;
  uStack_db0 = uStack_fb0;
  local_d98 = local_ff8;
  uStack_d90 = uStack_fd0;
  local_d58 = local_1188;
  local_d50 = local_1188;
  local_d48 = local_11a8;
  local_d40 = local_11a8;
  local_d18 = local_1198;
  local_d10 = local_1190;
  local_d08 = local_11b8;
  local_d00 = local_11b0;
  local_1b68 = local_ff8;
  uStack_1b60 = uStack_ff0;
  local_1b58 = local_1018;
  uStack_1b50 = uStack_1010;
  local_1308 = local_cb8;
  uStack_1300 = uStack_cb0;
  local_12f8 = local_1018;
  uStack_12f0 = uStack_fb0;
  local_12d8 = local_1018;
  uStack_12d0 = uStack_1010;
  local_1298 = local_c98;
  uStack_1290 = uStack_c90;
  local_1288 = local_ff8;
  uStack_1280 = uStack_fd0;
  local_1268 = local_ff8;
  uStack_1260 = uStack_ff0;
  rtcIntersect1(g_scene,local_1930,0);
  local_18f0 = local_1b00;
  *local_1b00 = *local_1b00 + 1;
  local_18e4 = 0;
  local_b88 = 0;
  local_b98 = 0;
  uStack_b94 = 0;
  uStack_b90 = 0;
  uStack_b8c = 0;
  uVar7 = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  uVar8 = extraout_XMM1_Qa;
  if (local_1b20 != -1) {
    if (local_1b20 == 0) {
      local_1a88 = &local_1bd8;
      local_1a8c = 0x3f4ccccd;
      local_1a90 = 0;
      local_1a94 = 0;
      local_140c = 0;
      local_1410 = 0;
      local_1414 = 0;
      local_1418 = 0x3f4ccccd;
      local_1428 = 0x3f4ccccd;
      uStack_1420 = 0;
      local_1bd8 = 0x3f4ccccd;
      uStack_1bd0 = 0;
    }
    else {
      local_1aa0 = &local_1bd8;
      local_1aa4 = 0x3f666666;
      local_1aa8 = 0x3f19999a;
      local_1aac = 0x3f000000;
      local_13ec = 0;
      local_13f0 = 0x3f000000;
      local_13f4 = 0x3f19999a;
      local_13f8 = 0x3f666666;
      local_1408 = 0x3f19999a3f666666;
      uStack_1400 = 0x3f000000;
      local_1bd8 = 0x3f19999a3f666666;
      uStack_1bd0 = 0x3f000000;
    }
    local_1ac8 = &local_1bf8;
    local_1878 = &local_1bd8;
    local_187c = 0x3f000000;
    local_1860 = &local_1898;
    local_1864 = 0x3f000000;
    local_bbc = 0x3f000000;
    local_bd8 = 0x3f000000;
    uStack_bd4 = 0x3f000000;
    uStack_bd0 = 0x3f000000;
    uStack_bcc = 0x3f000000;
    local_1898 = 0x3f0000003f000000;
    uStack_1890 = 0x3f0000003f000000;
    local_1688 = 0x3f0000003f000000;
    uStack_1680 = 0x3f0000003f000000;
    local_1678._0_4_ = (float)local_1bd8;
    local_1678._4_4_ = (float)((ulong)local_1bd8 >> 0x20);
    uStack_1670._0_4_ = (float)uStack_1bd0;
    local_15e8 = (float)local_1678 * 0.5;
    fStack_15e4 = local_1678._4_4_ * 0.5;
    fStack_15e0 = (float)uStack_1670 * 0.5;
    uStack_15dc = 0;
    local_14e8 = CONCAT44(fStack_15e4,local_15e8);
    uStack_14e0 = (ulong)(uint)fStack_15e0;
    local_1ab8 = &local_1be8;
    uVar8 = *in_RDI;
    uVar7 = in_RDI[1];
    local_14d8._0_4_ = (float)uVar8;
    local_14d8._4_4_ = (float)(uVar8 >> 0x20);
    uStack_14d0._0_4_ = (float)uVar7;
    uStack_14d0._4_4_ = (float)(uVar7 >> 0x20);
    local_1548 = (float)local_14d8 + local_15e8;
    fStack_1544 = local_14d8._4_4_ + fStack_15e4;
    fStack_1540 = (float)uStack_14d0 + fStack_15e0;
    fStack_153c = uStack_14d0._4_4_ + 0.0;
    local_1be8 = CONCAT44(fStack_1544,local_1548);
    uStack_1be0 = CONCAT44(fStack_153c,fStack_1540);
    *in_RDI = local_1be8;
    in_RDI[1] = uStack_1be0;
    local_1a70 = &local_1c18;
    local_1a74 = 0xbf800000;
    local_1a78 = 0xbf800000;
    local_1a7c = 0xbf800000;
    local_142c = 0;
    local_1430 = 0xbf800000;
    local_1434 = 0xbf800000;
    local_1438 = 0xbf800000;
    local_1448 = 0xbf800000bf800000;
    uStack_1440 = 0xbf800000;
    local_1c18 = 0xbf800000bf800000;
    uStack_1c10 = 0xbf800000;
    local_1830 = &local_1c08;
    local_16f8 = &local_1768;
    local_1638 = 0xbf800000bf800000;
    uStack_1630 = 0xbf800000;
    local_1648 = 0xbf800000bf800000;
    uStack_1640 = 0xbf800000;
    local_15a8 = 0x3f800000;
    uStack_15a4 = 0x3f800000;
    uStack_15a0 = 0x3f800000;
    uStack_159c = 0;
    local_4c8 = 0x3f8000003f800000;
    uStack_4c0 = 0x3f800000;
    local_4b8 = &local_4e8;
    local_488 = &local_4f8;
    local_3d8 = 0x3f8000003f800000;
    uStack_3d0 = 0x3f8000003f800000;
    local_468 = &local_508;
    local_438 = 0x3f8000003f800000;
    uStack_430 = 0x3f8000003f800000;
    local_448 = &local_528;
    local_3b8 = 0x40000000;
    uStack_3b4 = 0x40000000;
    uStack_3b0 = 0x40000000;
    uStack_3ac = 0x3f800000;
    local_428 = 0x4000000040000000;
    uStack_420 = 0x3f80000040000000;
    local_4b0 = &local_518;
    local_b3c = 0x40400000;
    uStack_414 = 0x40400000;
    uStack_410 = 0x40400000;
    uStack_40c = 0x40000000;
    local_4a8 = 0x4040000040400000;
    uStack_4a0 = 0x4000000040400000;
    local_9b8 = ZEXT416(0x40400000);
    local_b58 = 0x40400000;
    uStack_b50 = 0;
    local_978 = 0x40400000;
    uStack_970 = 0;
    local_b68 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
    local_9bc = 0x3fc00000;
    local_9d8 = ZEXT416(0x3fc00000);
    local_748 = local_b68._0_8_;
    uVar4 = local_748;
    uStack_740 = local_b68._8_8_;
    local_748._0_4_ = local_b68._0_4_;
    local_738 = (ulong)(uint)((float)local_748 * 1.5);
    uStack_730 = 0;
    local_9dc = 0xbf000000;
    local_9f8 = ZEXT416(0xbf000000);
    local_768 = local_9f8._0_8_;
    uStack_760 = 0;
    local_758 = 0xbfc00000;
    uStack_750 = 0;
    local_788 = local_b68._0_8_;
    uStack_780 = local_b68._8_8_;
    local_778 = (ulong)(uint)((float)local_748 * -1.5);
    uStack_770 = 0;
    local_7a8 = local_b68._0_8_;
    uStack_7a0 = local_b68._8_8_;
    local_798 = CONCAT44(local_b68._4_4_,(float)local_748 * (float)local_748);
    uStack_790 = local_b68._8_8_;
    local_7c8 = local_798;
    uStack_7c0 = local_b68._8_8_;
    local_1814 = (float)local_748 * -1.5 * (float)local_748 * (float)local_748;
    local_7b8 = (ulong)(uint)local_1814;
    uStack_7b0 = 0;
    local_928 = local_7b8;
    uStack_920 = 0;
    local_1814 = (float)local_748 * 1.5 + local_1814;
    local_918 = (ulong)(uint)local_1814;
    uStack_910 = 0;
    local_b78 = local_918;
    uStack_b70 = 0;
    local_708 = local_918;
    uStack_700 = 0;
    local_17f8 = &local_1828;
    local_1668 = CONCAT44(local_1814,local_1814);
    uStack_1660 = CONCAT44(local_1814,local_1814);
    local_1658 = 0xbf800000bf800000;
    uStack_1650 = 0xbf800000;
    local_15c8 = local_1814 * -1.0;
    fStack_15c4 = local_1814 * -1.0;
    fStack_15c0 = local_1814 * -1.0;
    fStack_15bc = local_1814 * 0.0;
    uStack_5c0 = CONCAT44(fStack_15bc,fStack_15c0);
    local_1a30 = &local_1b38;
    local_1a48 = local_1c34;
    local_c = local_1b30 * local_1b30;
    local_18 = local_1b34 * local_1b34 + local_c;
    local_abc = local_1b38 * local_1b38 + local_18;
    local_a78._4_4_ = 0;
    local_a78._0_4_ = local_abc;
    local_ad8 = local_a78._0_8_;
    uStack_ad0 = 0;
    local_998 = local_a78._0_8_;
    uStack_990 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_a78._0_8_;
    local_ae8 = rsqrtss(auVar1,auVar1);
    local_a7c = 0x3fc00000;
    local_a98 = ZEXT416(0x3fc00000);
    local_888 = local_ae8._0_8_;
    uVar3 = local_888;
    uStack_880 = local_ae8._8_8_;
    local_888._0_4_ = local_ae8._0_4_;
    local_878 = (ulong)(uint)((float)local_888 * 1.5);
    uStack_870 = 0;
    local_a9c = 0xbf000000;
    local_ab8 = ZEXT416(0xbf000000);
    local_8a8 = local_ab8._0_8_;
    uStack_8a0 = 0;
    local_898 = (ulong)(uint)(local_abc * -0.5);
    uStack_890 = 0;
    local_8c8 = local_ae8._0_8_;
    uStack_8c0 = local_ae8._8_8_;
    local_1a34 = local_abc * -0.5 * (float)local_888;
    local_8b8 = (ulong)(uint)local_1a34;
    uStack_8b0 = 0;
    local_8e8 = local_ae8._0_8_;
    uStack_8e0 = local_ae8._8_8_;
    local_8d8 = CONCAT44(local_ae8._4_4_,(float)local_888 * (float)local_888);
    uStack_8d0 = local_ae8._8_8_;
    local_908 = local_8d8;
    uStack_900 = local_ae8._8_8_;
    local_1a34 = local_1a34 * (float)local_888 * (float)local_888;
    local_8f8 = (ulong)(uint)local_1a34;
    uStack_8f0 = 0;
    local_968 = local_8f8;
    uStack_960 = 0;
    local_1a34 = (float)local_888 * 1.5 + local_1a34;
    local_958 = (ulong)(uint)local_1a34;
    uStack_950 = 0;
    local_af8 = local_958;
    uStack_af0 = 0;
    local_728 = local_958;
    uStack_720 = 0;
    local_98 = &local_1a34;
    local_1498 = local_1b38 * local_1a34;
    local_70 = &local_9c;
    local_78 = &local_a0;
    local_80 = &local_a4;
    fStack_1c24 = local_a0;
    local_1a40 = &local_1c28;
    local_148c = 0;
    uStack_14a0 = (ulong)(uint)local_a4;
    local_17c8 = &local_1b58;
    local_17f0 = &local_1cc8;
    local_17bc = local_1b48;
    local_6d8 = local_17d8;
    local_684 = local_1b48;
    local_65c = local_1b48;
    local_678 = local_1b48;
    fStack_674 = local_1b48;
    fStack_670 = local_1b48;
    fStack_66c = local_1b48;
    local_6c8._0_4_ = (float)local_1b58;
    local_6c8._4_4_ = (float)((ulong)local_1b58 >> 0x20);
    uStack_6c0._0_4_ = (float)uStack_1b50;
    uStack_6c0._4_4_ = (float)(uStack_1b50 >> 0x20);
    local_6a8 = local_1b48 * (float)local_6c8;
    fStack_6a4 = local_1b48 * local_6c8._4_4_;
    fStack_6a0 = local_1b48 * (float)uStack_6c0;
    fStack_69c = local_1b48 * uStack_6c0._4_4_;
    local_1508 = CONCAT44(fStack_6a4,local_6a8);
    uStack_1500 = CONCAT44(fStack_69c,fStack_6a0);
    local_17e0 = &local_1cb8;
    local_17e8 = &local_1b68;
    local_14f8._0_4_ = (float)local_1b68;
    local_14f8._4_4_ = (float)((ulong)local_1b68 >> 0x20);
    uStack_14f0._0_4_ = (float)uStack_1b60;
    uStack_14f0._4_4_ = (float)(uStack_1b60 >> 0x20);
    local_6f8 = (float)local_14f8 + local_6a8;
    fStack_6f4 = local_14f8._4_4_ + fStack_6a4;
    fStack_6f0 = (float)uStack_14f0 + fStack_6a0;
    fStack_6ec = uStack_14f0._4_4_ + fStack_69c;
    local_1568 = CONCAT44(fStack_6f4,local_6f8);
    uStack_1560 = CONCAT44(fStack_6ec,fStack_6f0);
    local_5fc = 0x80000000;
    local_5dc = 0x80000000;
    local_5e0 = 0x80000000;
    local_5e4 = 0x80000000;
    local_5e8 = 0x80000000;
    local_658 = 0x8000000080000000;
    uStack_650 = 0x8000000080000000;
    local_638 = -local_15c8;
    fStack_634 = -fStack_15c4;
    uStack_630 = uStack_5c0 ^ 0x8000000080000000;
    local_1968 = &inf;
    local_1a28 = local_1a48;
    local_1870 = local_1ac8;
    local_1848 = local_1ab8;
    local_1838 = local_1a70;
    local_1810 = local_1a70;
    local_1808 = local_1830;
    local_17fc = local_1814;
    local_17b8 = local_17f0;
    local_17b0 = local_17e0;
    local_17a8 = &local_1ca8;
    local_17a0 = local_1830;
    local_1798 = local_1cd8;
    local_1758 = local_1a70;
    local_1750 = local_1a70;
    local_1708 = local_1a70;
    local_1700 = local_1a70;
    local_16f0 = local_17f8;
    local_16e8 = local_1a70;
    local_16e0 = local_1830;
    local_16d8 = local_1860;
    local_16d0 = local_1878;
    local_16c8 = local_1ac8;
    local_1678 = local_1bd8;
    uStack_1670 = uStack_1bd0;
    local_15d0 = local_1ac8;
    local_15b0 = local_1830;
    local_1590 = local_16f8;
    local_1550 = &local_1ca8;
    local_1530 = local_1ab8;
    local_14f8 = local_1b68;
    uStack_14f0 = uStack_1b60;
    local_14d8 = uVar8;
    uStack_14d0 = uVar7;
    local_bf8 = local_1814;
    fStack_bf4 = local_1814;
    fStack_bf0 = local_1814;
    fStack_bec = local_1814;
    local_bdc = local_1814;
    local_a78 = ZEXT416((uint)local_abc);
    local_a5c = local_abc;
    local_99c = local_b3c;
    local_888 = uVar3;
    local_748 = uVar4;
    local_6e8 = local_17e0;
    local_6e0 = local_17c8;
    local_6d0 = local_17f0;
    local_6c8 = local_1b58;
    uStack_6c0 = uStack_1b50;
    local_690 = local_17f0;
    local_680 = local_6d8;
    local_648 = local_1830;
    local_640 = local_1cd8;
    local_620 = local_1cd8;
    local_618 = local_658;
    uStack_610 = uStack_650;
    local_5f8 = local_658;
    uStack_5f0 = uStack_650;
    local_5d8 = local_658;
    uStack_5d0 = uStack_650;
    local_4d0 = local_16f8;
    local_490 = local_4b8;
    local_470 = local_4b8;
    local_450 = local_468;
    local_440 = local_4b0;
    local_418 = local_b3c;
    local_408 = local_4b0;
    local_400 = local_468;
    local_3f8 = local_448;
    local_3f0 = local_488;
    local_3e8 = local_4b8;
    local_3e0 = local_448;
    local_3c8 = local_4c8;
    uStack_3c0 = uStack_4c0;
    local_3a8 = local_448;
    local_3a0 = local_488;
    local_398 = local_4b8;
    local_288 = local_4b8;
    local_280 = local_488;
    local_278 = uStack_15a4;
    uStack_274 = uStack_15a4;
    uStack_270 = uStack_15a4;
    uStack_26c = uStack_15a4;
    local_268 = local_3d8;
    uStack_260 = uStack_3d0;
    local_258 = local_488;
    local_250 = local_4b8;
    local_248 = local_4c8;
    uStack_240 = uStack_4c0;
    local_1d8 = local_4b8;
    local_1d0 = local_468;
    local_1c8 = uStack_15a0;
    uStack_1c4 = uStack_15a0;
    uStack_1c0 = uStack_15a0;
    uStack_1bc = uStack_15a0;
    local_1b8 = local_438;
    uStack_1b0 = uStack_430;
    local_1a8 = local_468;
    local_1a0 = local_4b8;
    local_198 = local_4c8;
    uStack_190 = uStack_4c0;
    local_a4 = local_1b30 * local_1a34;
    local_a0 = local_1b34 * local_1a34;
    local_9c = local_1498;
    local_90 = local_1a30;
    local_88 = local_1a48;
    local_68 = local_1a48;
    local_58 = local_1a30;
    local_50 = local_1a30;
    local_48 = local_1a30;
    uStack_1cd0 = uStack_630;
    local_1cc8 = local_1508;
    uStack_1cc0 = uStack_1500;
    local_1cb8 = local_1568;
    uStack_1cb0 = uStack_1560;
    local_1ca8 = local_1568;
    uStack_1ca0 = uStack_1560;
    local_1c34[0] = local_1498;
    uStack_1c20 = uStack_14a0;
    uStack_1c00 = uStack_5c0;
    local_1bf8 = local_14e8;
    uStack_1bf0 = uStack_14e0;
    local_1828 = local_1668;
    uStack_1820 = uStack_1660;
    local_1768 = local_4c8;
    uStack_1760 = uStack_4c0;
    local_528 = local_428;
    uStack_520 = uStack_420;
    local_518 = local_4a8;
    uStack_510 = uStack_4a0;
    local_508 = local_438;
    uStack_500 = uStack_430;
    local_4f8 = local_3d8;
    uStack_4f0 = uStack_3d0;
    local_4e8 = local_4c8;
    uStack_4e0 = uStack_4c0;
    local_1c08 = local_15c8;
    fStack_1c04 = fStack_15c4;
    local_5c8 = local_15c8;
    fStack_5c4 = fStack_15c4;
    local_1c28 = local_1498;
    local_14a8 = local_1498;
    local_1c78 = std::numeric_limits<float>::infinity();
    local_1900 = &local_1c98;
    local_1914 = 0x3a83126f;
    local_191c = 0;
    local_1920 = 0xffffffff;
    local_1924 = 0xffffffff;
    local_1928 = 0xffffffff;
    local_131c = 0x3a83126f;
    local_11d8 = &local_1338;
    local_11dc = 0xffffffff;
    local_11e0 = 0xffffffff;
    local_11e4 = 0xffffffff;
    local_11e8 = 0;
    local_ebc = 0;
    local_ec0 = 0xffffffff;
    local_ec4 = 0xffffffff;
    local_ec8 = 0xffffffff;
    local_ed8 = 0xffffffffffffffff;
    uStack_ed0 = 0xffffffff;
    local_1338 = 0xffffffffffffffff;
    uStack_1330 = 0xffffffff;
    local_1118 = 0xffffffffffffffff;
    uStack_1110 = 0xffffffff;
    local_1168 = &local_1358;
    local_1358 = 0xffffffffffffffff;
    uStack_1350 = 0xffffffff;
    local_1038 = local_1ca8;
    uStack_f90 = uStack_1ca0;
    local_1170 = &local_1368;
    local_1178 = &local_1378;
    local_f34 = 0x3a83126f;
    local_c3c = 0x3a83126f;
    local_c58 = 0x3a83126f;
    uStack_c54 = 0x3a83126f;
    uStack_c50 = 0x3a83126f;
    uStack_c4c = 0x3a83126f;
    local_cd8 = 0x3a83126f3a83126f;
    uStack_cd0 = 0x3a83126f3a83126f;
    local_1160 = &local_1348;
    local_dc8 = 0xffffffffffffffff;
    uStack_dc0 = 0xffffffff;
    uStack_e40 = uStack_1ca0 & 0xffffffff;
    local_cc8 = 0xffffffffffffffff;
    uStack_cc0 = 0xffffffff;
    local_e58 = 0;
    uStack_e50 = 0x3a83126f00000000;
    uStack_1030 = uStack_e40 | 0x3a83126f00000000;
    local_1380 = local_1c88;
    local_138c = 0;
    local_11c0 = &local_13a8;
    local_11c4 = 0xffffffff;
    local_11c8 = 0xffffffff;
    local_11cc = 0xffffffff;
    local_11d0 = 0;
    local_edc = 0;
    local_ee0 = 0xffffffff;
    local_ee4 = 0xffffffff;
    local_ee8 = 0xffffffff;
    local_ef8 = 0xffffffffffffffff;
    uStack_ef0 = 0xffffffff;
    local_13a8 = 0xffffffffffffffff;
    uStack_13a0 = 0xffffffff;
    local_1108 = 0xffffffffffffffff;
    uStack_1100 = 0xffffffff;
    local_1148 = &local_13c8;
    local_13c8 = 0xffffffffffffffff;
    uStack_13c0 = 0xffffffff;
    uStack_f70 = uStack_1cd0;
    local_1150 = local_13d8;
    local_1158 = &local_13e8;
    local_f24 = 0;
    local_c5c = 0;
    local_c78 = 0;
    uStack_c74 = 0;
    uStack_c70 = 0;
    uStack_c6c = 0;
    local_cf8 = 0;
    uStack_cf0 = 0;
    local_1140 = local_13b8;
    local_de8 = 0xffffffffffffffff;
    uStack_de0 = 0xffffffff;
    uStack_1050 = uStack_1cd0 & 0xffffffff;
    local_ce8 = 0xffffffffffffffff;
    uStack_ce0 = 0xffffffff;
    local_e78 = 0;
    uStack_e74 = 0;
    uStack_e70 = 0;
    uStack_e6c = 0;
    local_1040 = local_13b8;
    local_f00 = local_13b8;
    local_1c74 = 0xffffffff;
    local_1228 = auStack_1c68;
    local_1c54 = 0xffffffff;
    local_1c50 = 0xffffffff;
    local_1c4c = 0xffffffff;
    local_1c48 = 0xffffffff;
    local_1790 = &local_1c98;
    local_1918 = local_1c78;
    local_1910 = local_1cd8;
    local_1908 = &local_1ca8;
    local_1388 = local_1cd8;
    local_1318 = &local_1ca8;
    local_1310 = local_1900;
    local_10e8 = local_11d8;
    local_10e0 = local_11c0;
    local_1098 = local_1118;
    uStack_1090 = uStack_1110;
    local_1080 = local_1168;
    local_1078 = local_1108;
    uStack_1070 = uStack_1100;
    local_1060 = local_1148;
    local_1020 = local_1160;
    local_f98 = local_1038;
    local_f80 = local_1170;
    local_f60 = local_1150;
    local_f30 = local_1178;
    local_f20 = local_1158;
    local_f08 = local_1160;
    uStack_e60 = uStack_1050;
    local_e48 = local_1038;
    uStack_df0 = uStack_f70;
    local_dd8 = local_1038;
    uStack_dd0 = uStack_f90;
    local_d78 = local_1148;
    local_d70 = local_1148;
    local_d68 = local_1168;
    local_d60 = local_1168;
    local_d38 = local_1158;
    local_d30 = local_1150;
    local_d28 = local_1178;
    local_d20 = local_1170;
    local_1c98 = local_1038;
    uStack_1c90 = uStack_1030;
    uStack_1c80 = uStack_1050;
    local_13e8 = local_cf8;
    uStack_13e0 = uStack_cf0;
    uStack_13d0 = uStack_f70;
    uStack_13b0 = uStack_1050;
    local_1378 = local_cd8;
    uStack_1370 = uStack_cd0;
    local_1368 = local_1038;
    uStack_1360 = uStack_f90;
    local_1348 = local_1038;
    uStack_1340 = uStack_1030;
    rtcOccluded1(g_scene,local_1790,0);
    *local_1b00 = *local_1b00 + 1;
    uVar7 = (ulong)(uint)local_1c78;
    uVar8 = 0;
    if (0.0 <= local_1c78) {
      fStack_1610 = (float)uStack_1c00;
      fStack_1620 = (float)uStack_1c20;
      fVar5 = -(local_1c08 * local_1c28 + fStack_1c04 * fStack_1c24 + fStack_1610 * fStack_1620);
      local_1d4c = 1.0;
      if (fVar5 < 1.0) {
        local_1d4c = fVar5;
      }
      local_1d50 = 0.0;
      if (0.0 <= local_1d4c) {
        local_1d50 = local_1d4c;
      }
      local_1698 = (float)local_1bd8;
      fStack_1694 = (float)((ulong)local_1bd8 >> 0x20);
      fStack_1690 = (float)uStack_1bd0;
      fStack_168c = (float)((ulong)uStack_1bd0 >> 0x20);
      uVar8 = *in_RDI;
      local_14b8 = (float)uVar8;
      fStack_14b4 = (float)(uVar8 >> 0x20);
      fStack_14b0 = (float)in_RDI[1];
      fStack_14ac = (float)(in_RDI[1] >> 0x20);
      uVar7 = CONCAT44(fStack_14b4 + fStack_1694 * local_1d50,local_14b8 + local_1698 * local_1d50);
      *in_RDI = uVar7;
      in_RDI[1] = CONCAT44(fStack_14ac + fStack_168c * local_1d50,
                           fStack_14b0 + fStack_1690 * local_1d50);
    }
  }
  VVar9.field_0._8_8_ = uVar8;
  VVar9.field_0._0_8_ = uVar7;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa renderPixelStandard(float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  rtcIntersect1(g_scene,RTCRayHit_(ray));
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = ray.geomID != 0 ? Vec3fa(0.9f,0.6f,0.5f) : Vec3fa(0.8f,0.0f,0.0f);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    Vec3fa Ng = normalize(ray.Ng);
#if ENABLE_SMOOTH_NORMALS
    Vec3fa P = ray.org + ray.tfar*ray.dir;
    if (ray.geomID > 0) {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(g_scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      Ng = normalize(cross(dPdu,dPdv));
      dPdu = dPdu + Ng*displacement_du(P,dPdu);
      dPdv = dPdv + Ng*displacement_dv(P,dPdv);
      Ng = normalize(cross(dPdu,dPdv));
    }
#endif

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    rtcOccluded1(g_scene,RTCRay_(shadow));
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-(dot(lightDir,Ng)),0.0f,1.0f);
  }
  return color;
}